

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall dxil_spv::Converter::Impl::emit_global_variables(Impl *this)

{
  GlobalVariable *this_00;
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  LinkageTypes LVar5;
  TypeID TVar6;
  Id IVar7;
  Id IVar8;
  ValueKind VVar9;
  Module *this_01;
  __normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
  _Var10;
  __normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
  _Var11;
  Type *pTVar12;
  Type *pTVar13;
  Builder *pBVar14;
  Builder *pBVar15;
  uint64_t uVar16;
  Constant *constant;
  Value *this_02;
  LoggingCallback p_Var17;
  void *pvVar18;
  const_iterator cVar19;
  IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
  IVar20;
  StorageClass storage;
  char cVar21;
  char buffer [4096];
  GlobalVariable *local_1038 [513];
  
  this_01 = LLVMBCParser::get_module(this->bitcode_parser);
  if ((4 < this->execution_model - ExecutionModelIntersectionKHR) ||
     ((bVar2 = emit_incoming_payload(this), bVar2 &&
      ((2 < this->execution_model - ExecutionModelIntersectionKHR ||
       (bVar2 = emit_hit_attribute(this), bVar2)))))) {
    _Var10._M_current = (GlobalVariable **)LLVMBC::Module::global_begin(this_01);
    _Var11._M_current = (GlobalVariable **)LLVMBC::Module::global_end(this_01);
    bVar2 = true;
    if (_Var10._M_current != _Var11._M_current) {
      do {
        this_00 = *_Var10._M_current;
        pTVar12 = LLVMBC::Value::getType((Value *)this_00);
        uVar4 = LLVMBC::Type::getAddressSpace(pTVar12);
        LVar5 = LLVMBC::GlobalVariable::getLinkage(this_00);
        cVar21 = (char)uVar4;
        if ((LVar5 != ExternalLinkage || cVar21 == '\x03') &&
           (LVar5 = LLVMBC::GlobalVariable::getLinkage(this_00), LVar5 != AppendingLinkage)) {
          if (cVar21 == '\x03') {
            if ((this->shader_analysis).require_wmma != true) goto LAB_0011e4f7;
            pTVar12 = LLVMBC::Value::getType((Value *)this_00);
            pTVar12 = LLVMBC::Type::getPointerElementType(pTVar12);
            if ((pTVar12 != (Type *)0x0) &&
               (TVar6 = LLVMBC::Type::getTypeID(pTVar12), TVar6 == ArrayTyID)) {
              pTVar13 = LLVMBC::Type::getArrayElementType(pTVar12);
              bVar2 = false;
              IVar7 = get_type_id(this,pTVar13,0);
              uVar16 = LLVMBC::Type::getArrayNumElements(pTVar12);
              pTVar12 = LLVMBC::Type::getArrayElementType(pTVar12);
              uVar4 = LLVMBC::Type::getIntegerBitWidth(pTVar12);
              iVar1 = (int)(0x1000 / (ulong)uVar4);
              pBVar14 = SPIRVModule::get_builder(this->spirv_module);
              pBVar15 = SPIRVModule::get_builder(this->spirv_module);
              IVar8 = spv::Builder::makeIntegerType(pBVar15,0x20,false);
              IVar8 = spv::Builder::makeIntConstant
                                (pBVar15,IVar8,((int)uVar16 + iVar1) - 1U & -iVar1,false);
              IVar7 = spv::Builder::makeArrayType(pBVar14,IVar7,IVar8,0);
              goto LAB_0011e4eb;
            }
LAB_0011e5a8:
            bVar2 = false;
LAB_0011e4fa:
            pTVar12 = LLVMBC::Value::getType((Value *)this_00);
            pTVar12 = LLVMBC::Type::getPointerElementType(pTVar12);
            IVar7 = get_type_id(this,pTVar12,0);
            if (IVar7 == 0) goto LAB_0011e651;
          }
          else {
            if (((((uVar4 & 0xff) != 0) ||
                 ((this->options).extended_robustness.constant_lut != true)) ||
                (bVar2 = LLVMBC::GlobalVariable::hasInitializer(this_00), !bVar2)) ||
               (bVar2 = LLVMBC::GlobalVariable::isConstant(this_00), !bVar2)) {
LAB_0011e4f7:
              bVar2 = false;
              goto LAB_0011e4fa;
            }
            pTVar12 = LLVMBC::Value::getType((Value *)this_00);
            pTVar12 = LLVMBC::Type::getPointerElementType(pTVar12);
            if ((pTVar12 == (Type *)0x0) ||
               (TVar6 = LLVMBC::Type::getTypeID(pTVar12), TVar6 != ArrayTyID)) goto LAB_0011e5a8;
            pTVar13 = LLVMBC::Type::getArrayElementType(pTVar12);
            IVar7 = get_type_id(this,pTVar13,0);
            pBVar14 = SPIRVModule::get_builder(this->spirv_module);
            pBVar15 = SPIRVModule::get_builder(this->spirv_module);
            uVar16 = LLVMBC::Type::getArrayNumElements(pTVar12);
            IVar8 = spv::Builder::makeIntegerType(pBVar15,0x20,false);
            IVar8 = spv::Builder::makeIntConstant(pBVar15,IVar8,(int)uVar16 + 1,false);
            IVar7 = spv::Builder::makeArrayType(pBVar14,IVar7,IVar8,0);
            bVar2 = true;
LAB_0011e4eb:
            if (IVar7 == 0) goto LAB_0011e4fa;
          }
          bVar3 = LLVMBC::GlobalVariable::hasInitializer(this_00);
          if ((bVar3) &&
             (constant = LLVMBC::GlobalVariable::getInitializer(this_00),
             constant != (Constant *)0x0)) {
            this_02 = LLVMBC::Internal::resolve_proxy(&constant->super_Value);
            VVar9 = LLVMBC::Value::get_value_kind(this_02);
            if (cVar21 != '\x03' || VVar9 == Undef) {
              if (VVar9 == Undef) goto LAB_0011e5d8;
              if (bVar2) {
                IVar8 = get_padded_constant_array(this,IVar7,constant);
              }
              else {
                IVar8 = get_id_for_constant(this,constant,0);
              }
              goto LAB_0011e5e0;
            }
            p_Var17 = get_thread_log_callback();
            if (p_Var17 == (LoggingCallback)0x0) {
              emit_global_variables();
            }
            else {
              memcpy(local_1038,
                     "Global variable address space cannot have initializer! Ignoring ...\n",0x45);
              pvVar18 = get_thread_log_callback_userdata();
              (*p_Var17)(pvVar18,Warn,(char *)local_1038);
            }
            IVar8 = 0;
LAB_0011e5e6:
            storage = StorageClassWorkgroup;
          }
          else {
LAB_0011e5d8:
            IVar8 = 0;
LAB_0011e5e0:
            storage = StorageClassPrivate;
            if (cVar21 == '\x03') goto LAB_0011e5e6;
          }
          local_1038[0] = this_00;
          cVar19 = std::
                   _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->handle_to_storage_class)._M_h,(key_type *)local_1038);
          if (cVar19.
              super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_false>
              ._M_cur != (__node_type *)0x0) {
            storage = *(StorageClass *)
                       ((long)cVar19.
                              super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_false>
                              ._M_cur + 0x10);
          }
          IVar7 = SPIRVModule::create_variable_with_initializer
                            (this->spirv_module,storage,IVar7,IVar8,(char *)0x0);
          pTVar12 = LLVMBC::Value::getType((Value *)this_00);
          pTVar12 = LLVMBC::Type::getPointerElementType(pTVar12);
          decorate_relaxed_precision(this,pTVar12,IVar7,false);
          rewrite_value(this,(Value *)this_00,IVar7);
        }
LAB_0011e651:
        _Var10._M_current = _Var10._M_current + 1;
        IVar20 = LLVMBC::Module::global_end(this_01);
      } while ((__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
                )_Var10._M_current != IVar20.iter._M_current);
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Converter::Impl::emit_global_variables()
{
	auto &module = bitcode_parser.get_module();

	if (execution_model_has_incoming_payload(execution_model))
		if (!emit_incoming_payload())
			return false;

	if (execution_model_has_hit_attribute(execution_model))
		if (!emit_hit_attribute())
			return false;

	for (auto itr = module.global_begin(); itr != module.global_end(); ++itr)
	{
		llvm::GlobalVariable &global = *itr;

		auto address_space = static_cast<DXIL::AddressSpace>(global.getType()->getAddressSpace());

		// Workarounds for DXR. RT resources tend to be declared with external linkage + structs.
		// Groupshared is also declared with external linkage, even if that is bogus.
		// Make sure we declare global internal struct LUTs at the very least ...
		if (global.getLinkage() == llvm::GlobalVariable::ExternalLinkage &&
		    address_space != DXIL::AddressSpace::GroupShared)
		{
			continue;
		}

		// Ignore @llvm.global_ctors(). Only observed once with dummy ctor.
		// It probably is not intended to work.
		if (global.getLinkage() == llvm::GlobalVariable::AppendingLinkage)
			continue;

		spv::Id pointee_type_id = 0;
		spv::Id scalar_type_id = 0;
		bool padded_composite = false;

		if (address_space == DXIL::AddressSpace::Thread &&
		    options.extended_robustness.constant_lut &&
		    global.hasInitializer() &&
		    global.isConstant())
		{
			if (auto *array_type = llvm::dyn_cast<llvm::ArrayType>(global.getType()->getPointerElementType()))
			{
				scalar_type_id = get_type_id(array_type->getArrayElementType());
				pointee_type_id = builder().makeArrayType(
					scalar_type_id, builder().makeUintConstant(array_type->getArrayNumElements() + 1), false);
				padded_composite = true;
			}
		}
		else if (address_space == DXIL::AddressSpace::GroupShared &&
		         shader_analysis.require_wmma)
		{
			// Workaround for bugged WMMA shaders.
			// The shaders rely on AMD aligning LDS size to 512 bytes.
			// This avoids overflow spilling into LDSTranspose area by mistake, which breaks some shaders.
			if (auto *array_type = llvm::dyn_cast<llvm::ArrayType>(global.getType()->getPointerElementType()))
			{
				scalar_type_id = get_type_id(array_type->getArrayElementType());
				uint32_t elem_count = array_type->getArrayNumElements();
				uint32_t alignment = (512 * 8) / array_type->getArrayElementType()->getIntegerBitWidth();
				elem_count = (elem_count + alignment - 1) & ~(alignment - 1);
				pointee_type_id = builder().makeArrayType(
					scalar_type_id, builder().makeUintConstant(elem_count), false);
			}
		}

		if (!pointee_type_id)
			pointee_type_id = get_type_id(global.getType()->getPointerElementType());

		// Happens for some global variables in DXR for some reason, benign.
		if (pointee_type_id == 0)
			continue;

		spv::Id initializer_id = 0;

		llvm::Constant *initializer = nullptr;
		if (global.hasInitializer())
			initializer = global.getInitializer();
		if (initializer && llvm::isa<llvm::UndefValue>(initializer))
			initializer = nullptr;

		if (address_space == DXIL::AddressSpace::GroupShared)
		{
			if (initializer)
			{
				// FIXME: Is this even legal DXIL?
				LOGW("Global variable address space cannot have initializer! Ignoring ...\n");
				initializer = nullptr;
			}
		}

		if (initializer)
		{
			if (padded_composite)
				initializer_id = get_padded_constant_array(pointee_type_id, initializer);
			else
				initializer_id = get_id_for_constant(initializer, 0);
		}

		spv::StorageClass storage_class = address_space == DXIL::AddressSpace::GroupShared
		                                  ? spv::StorageClassWorkgroup : spv::StorageClassPrivate;
		spv::Id var_id = create_variable_with_initializer(
			get_effective_storage_class(&global, storage_class),
			pointee_type_id, initializer_id);

		decorate_relaxed_precision(global.getType()->getPointerElementType(), var_id, false);
		rewrite_value(&global, var_id);
	}

	return true;
}